

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadExportSection(WasmBinaryReader *this)

{
  Type pWVar1;
  bool bVar2;
  ExternalKinds kind_00;
  uint uVar3;
  uint32 uVar4;
  Type funcType;
  uint uVar5;
  LocalFunctionId LVar6;
  ScriptContext *this_00;
  ThreadContext *this_01;
  PageAllocator *pageAllocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *this_02;
  WasmFunctionInfo *pWVar7;
  FunctionBody *pFVar8;
  WasmGlobal *this_03;
  anon_class_16_2_3567b36b predicate;
  WasmImport *import;
  Type type;
  uint32 index;
  ExternalKinds kind;
  TrackAllocData local_138;
  NameList *local_110;
  uint32 local_108;
  Type *local_100;
  char16 **found;
  NameList *list;
  char16 *exportName;
  uint local_e0;
  uint32 nameLength;
  uint32 iExport;
  undefined1 local_d0 [8];
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  exportsNameDict;
  ArenaAllocator tmpAlloc;
  uint32 numExports;
  uint32 length;
  WasmBinaryReader *this_local;
  
  uVar3 = LEB128<unsigned_int,32u>
                    (this,(uint32 *)
                          ((long)&tmpAlloc.
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  .freeList + 4));
  tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList._0_4_ =
       uVar3;
  uVar4 = Limits::GetMaxExports();
  if (uVar4 < uVar3) {
    ThrowDecodingError(this,L"Too many exports");
  }
  Js::WebAssemblyModule::AllocateFunctionExports
            (this->m_module,
             (uint)tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                   .freeList);
  this_00 = Js::RecyclableObject::GetScriptContext((RecyclableObject *)this->m_module);
  this_01 = Js::ScriptContext::GetThreadContext(this_00);
  pageAllocator = ThreadContext::GetPageAllocator(this_01);
  Memory::ArenaAllocator::ArenaAllocator
            ((ArenaAllocator *)&exportsNameDict.stats,L"ExportDupCheck",pageAllocator,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  JsUtil::
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_d0,(AllocatorType *)&exportsNameDict.stats,0);
  local_e0 = 0;
  do {
    if ((uint)tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList <= local_e0) {
      JsUtil::
      BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)local_d0);
      Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&exportsNameDict.stats);
      return;
    }
    list = (NameList *)
           ReadInlineName(this,(uint32 *)
                               ((long)&tmpAlloc.
                                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                       .freeList + 4),(uint32 *)((long)&exportName + 4));
    found = (char16 **)0x0;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      ((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)local_d0,(uint *)((long)&exportName + 4),
                       (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&found);
    if (bVar2) {
      local_110 = list;
      local_108 = exportName._4_4_;
      predicate.nameLength = exportName._4_4_;
      predicate.exportName = (char16 *)list;
      predicate._12_4_ = 0;
      local_100 = SListBase<char16_t_const*,Memory::ArenaAllocator,RealCount>::
                  Find<Wasm::WasmBinaryReader::ReadExportSection()::__0>
                            ((SListBase<char16_t_const*,Memory::ArenaAllocator,RealCount> *)found,
                             predicate);
      if (local_100 != (Type *)0x0) {
        ThrowDecodingError(this,L"Duplicate export name: %s",list);
      }
      local_100 = (Type *)0x0;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_138,
                 (type_info *)&SList<char16_t_const*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                 ,0x356);
      alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             &exportsNameDict.stats,&local_138);
      this_02 = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)alloc,0x3f67b0);
      SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::SList
                (this_02,(ArenaAllocator *)&exportsNameDict.stats);
      found = (char16 **)this_02;
      JsUtil::
      BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)local_d0,(uint *)((long)&exportName + 4),
            (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&found);
    }
    SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Push
              ((SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)found,
               (char16_t **)&list);
    kind_00 = ReadExternalKind(this);
    uVar3 = LEB128<unsigned_int,32u>
                      (this,(uint32 *)
                            ((long)&tmpAlloc.
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    .freeList + 4));
    switch(kind_00) {
    case Function:
      funcType = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,uVar3);
      bVar2 = FunctionIndexTypes::CanBeExported(funcType);
      if (!bVar2) {
        ThrowDecodingError(this,L"Invalid Export %u => func[%u]",(ulong)local_e0,(ulong)uVar3);
      }
      Js::WebAssemblyModule::SetExport
                (this->m_module,local_e0,uVar3,(char16 *)list,exportName._4_4_,kind_00);
      if (funcType == ImportThunk) {
        pWVar7 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar3);
        pWVar1 = pWVar7->importedFunctionReference;
        pFVar8 = GetFunctionBody(this);
        if (pFVar8 == (FunctionBody *)0x0) {
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
          if (bVar2) goto LAB_0160b06b;
        }
        else {
          pFVar8 = GetFunctionBody(this);
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
          pFVar8 = GetFunctionBody(this);
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase,uVar5,LVar6);
          if (bVar2) {
LAB_0160b06b:
            Output::Print(L"Export #%u: Import(%s.%s)(%u) => %s",(ulong)local_e0,pWVar1->modName,
                          pWVar1->importName,(ulong)uVar3,list);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
      }
      else {
        pFVar8 = GetFunctionBody(this);
        if (pFVar8 == (FunctionBody *)0x0) {
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
          if (bVar2) goto LAB_0160b16a;
        }
        else {
          pFVar8 = GetFunctionBody(this);
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar8);
          pFVar8 = GetFunctionBody(this);
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar8);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase,uVar5,LVar6);
          if (bVar2) {
LAB_0160b16a:
            Output::Print(L"Export #%u: Function(%u) => %s",(ulong)local_e0,(ulong)uVar3,list);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
      }
      break;
    case Table:
      if (uVar3 != 0) {
        ThrowDecodingError(this,L"Unknown table index %u for export %s",(ulong)uVar3,list);
      }
      Js::WebAssemblyModule::SetExport
                (this->m_module,local_e0,0,(char16 *)list,exportName._4_4_,kind_00);
      break;
    case Memory:
      if (uVar3 != 0) {
        ThrowDecodingError(this,L"Unknown memory index %u for export %s",(ulong)uVar3,list);
      }
      Js::WebAssemblyModule::SetExport
                (this->m_module,local_e0,0,(char16 *)list,exportName._4_4_,kind_00);
      break;
    case Global:
      uVar4 = Js::WebAssemblyModule::GetGlobalCount(this->m_module);
      if (uVar4 <= uVar3) {
        ThrowDecodingError(this,L"Unknown global %u for export %s",(ulong)uVar3,list);
      }
      this_03 = Js::WebAssemblyModule::GetGlobal(this->m_module,uVar3);
      bVar2 = WasmGlobal::IsMutable(this_03);
      if (bVar2) {
        ThrowDecodingError(this,L"Mutable globals cannot be exported",(ulong)uVar3,list);
      }
      Js::WebAssemblyModule::SetExport
                (this->m_module,local_e0,uVar3,(char16 *)list,exportName._4_4_,kind_00);
      break;
    default:
      ThrowDecodingError(this,L"Exported Kind %d, NYI",(ulong)kind_00);
    }
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadExportSection()
{
    uint32 length;
    uint32 numExports = LEB128(length);
    if (numExports > Limits::GetMaxExports())
    {
        ThrowDecodingError(_u("Too many exports"));
    }

    m_module->AllocateFunctionExports(numExports);

    ArenaAllocator tmpAlloc(_u("ExportDupCheck"), m_module->GetScriptContext()->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
    typedef SList<const char16*> NameList;
    JsUtil::BaseDictionary<uint32, NameList*, ArenaAllocator> exportsNameDict(&tmpAlloc);

    for (uint32 iExport = 0; iExport < numExports; iExport++)
    {
        uint32 nameLength;
        const char16* exportName = ReadInlineName(length, nameLength);

        // Check if the name is already used
        NameList* list = nullptr;
        if (exportsNameDict.TryGetValue(nameLength, &list))
        {
            const char16** found = list->Find([exportName, nameLength](const char16* existing) { 
                return wcsncmp(exportName, existing, nameLength) == 0;
            });
            if (found)
            {
                ThrowDecodingError(_u("Duplicate export name: %s"), exportName);
            }
        }
        else
        {
            list = Anew(&tmpAlloc, NameList, &tmpAlloc);
            exportsNameDict.Add(nameLength, list);
        }
        list->Push(exportName);

        ExternalKinds kind = ReadExternalKind();
        uint32 index = LEB128(length);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            FunctionIndexTypes::Type type = m_module->GetFunctionIndexType(index);
            if (!FunctionIndexTypes::CanBeExported(type))
            {
                ThrowDecodingError(_u("Invalid Export %u => func[%u]"), iExport, index);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);

#if DBG_DUMP
            if (type == FunctionIndexTypes::ImportThunk)
            {
                WasmImport* import = m_module->GetWasmFunctionInfo(index)->importedFunctionReference;
                TRACE_WASM_DECODER(_u("Export #%u: Import(%s.%s)(%u) => %s"), iExport, import->modName, import->importName, index, exportName);
            }
            else
            {
                TRACE_WASM_DECODER(_u("Export #%u: Function(%u) => %s"), iExport, index, exportName);
            }
#endif
            break;
        }
        case ExternalKinds::Memory:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown memory index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Table:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown table index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Global:
            if (index >= m_module->GetGlobalCount())
            {
                ThrowDecodingError(_u("Unknown global %u for export %s"), index, exportName);
            }
            if (m_module->GetGlobal(index)->IsMutable())
            {
                ThrowDecodingError(_u("Mutable globals cannot be exported"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        default:
            ThrowDecodingError(_u("Exported Kind %d, NYI"), kind);
            break;
        }

    }
}